

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryCompiler.h
# Opt level: O2

size_t __thiscall
std::hash<std::tuple<int,_int,_std::bitset<100UL>_>_>::operator()
          (hash<std::tuple<int,_int,_std::bitset<100UL>_>_> *this,
          tuple<int,_int,_std::bitset<100UL>_> *p)

{
  ulong uVar1;
  size_t sVar2;
  hash<std::bitset<100UL>_> h4;
  hash<std::bitset<100UL>_> local_11;
  
  uVar1 = (long)*(int *)&(p->super__Tuple_impl<0UL,_int,_int,_std::bitset<100UL>_>).
                         super__Tuple_impl<1UL,_int,_std::bitset<100UL>_>.field_0x14 + 0x9e3779b9;
  uVar1 = (uVar1 >> 2) + 0x9e3779b9 +
          uVar1 * 0x40 +
          (long)(p->super__Tuple_impl<0UL,_int,_int,_std::bitset<100UL>_>).
                super__Tuple_impl<1UL,_int,_std::bitset<100UL>_>.super__Head_base<1UL,_int,_false>.
                _M_head_impl ^ uVar1;
  sVar2 = hash<std::bitset<100UL>_>::operator()(&local_11,(bitset<100UL> *)p);
  return sVar2 + uVar1 * 0x40 + (uVar1 >> 2) + 0x9e3779b9 ^ uVar1;
}

Assistant:

HOT inline size_t operator()(const tuple<int,int,var_bitset>& p) const
	{
            size_t seed = 0;
            hash<int> h1;
            seed ^= h1(std::get<0>(p)) + 0x9e3779b9 + (seed << 6) + (seed >> 2);
            seed ^= h1(std::get<1>(p)) + 0x9e3779b9 + (seed << 6) + (seed >> 2);
            hash<var_bitset> h4;
            seed ^= h4(std::get<2>(p)) + 0x9e3779b9 + (seed << 6) + (seed >> 2);
            return seed;
	}